

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedField_ReserveLessThanDouble_Test::
~RepeatedField_ReserveLessThanDouble_Test(RepeatedField_ReserveLessThanDouble_Test *this)

{
  RepeatedField_ReserveLessThanDouble_Test *this_local;
  
  ~RepeatedField_ReserveLessThanDouble_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RepeatedField, ReserveLessThanDouble) {
  // Reserve less than double the previous space in the field and expect the
  // field to grow by double instead.
  RepeatedField<int> field;
  field.Reserve(20);
  int capacity = field.Capacity();
  field.Reserve(capacity * 1.5);

  EXPECT_LE(2 * capacity, ReservedSpace(&field));
}